

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

int mxx::exscan<int,mxx::max<int>>(undefined8 x,MPI_Op param_2)

{
  int iVar1;
  MPI_Datatype poVar2;
  MPI_Op poVar3;
  MPI_Comm poVar4;
  int local_68 [2];
  int result;
  custom_op<int,_true> op;
  comm *comm_local;
  int *x_local;
  
  op.m_op = param_2;
  custom_op<int,true>::custom_op<mxx::max<int>>();
  poVar2 = custom_op<int,_true>::get_type((custom_op<int,_true> *)&result);
  poVar3 = custom_op<int,_true>::get_op((custom_op<int,_true> *)&result);
  poVar4 = comm::operator_cast_to_ompi_communicator_t_((comm *)op.m_op);
  MPI_Exscan(x,local_68,1,poVar2,poVar3,poVar4);
  iVar1 = comm::rank((comm *)op.m_op);
  if (iVar1 == 0) {
    local_68[0] = 0;
  }
  iVar1 = local_68[0];
  custom_op<int,_true>::~custom_op((custom_op<int,_true> *)&result);
  return iVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}